

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildAsmTypedArr
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,uint32 slotIndex,RegSlot value,
          ViewType viewType)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  OpCodeAsmJs OVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  RegSlot srcRegSlot;
  RegSlot srcRegSlot_00;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  IntConstOpnd *src2Opnd;
  Instr *pIVar7;
  IndirOpnd *dstOpnd;
  undefined4 *puVar8;
  IndirOpnd *this_00;
  JITTimeFunctionBody *this_01;
  IndirOpnd *src1Opnd;
  uint uVar9;
  undefined6 in_register_00000032;
  MemAccessTypeInfo local_3c;
  MemAccessTypeInfo typeInfo;
  
  OVar4 = newOpcode & ~ExtendedOpcodePrefix;
  typeInfo.valueRegType._3_1_ = OVar4 == LdArr;
  ValueType::ValueType(&local_3c.arrayType);
  InitializeMemAccessTypeInfo(viewType,&local_3c);
  srcRegSlot = GetRegSlotFromTypedReg(this,value,local_3c.valueRegType);
  uVar9 = (uint)CONCAT62(in_register_00000032,newOpcode) & 0xfffffffd;
  if ((short)uVar9 == 0x5d) {
LAB_004feb02:
    pRVar5 = BuildSrcOpnd(this,4,TyVar);
    dstOpnd = IR::IndirOpnd::New(pRVar5,slotIndex,local_3c.type,this->m_func,false);
  }
  else {
    if (uVar9 != 0x5c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x663,
                         "(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst)"
                         ,
                         "newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst"
                        );
      if (!bVar2) goto LAB_004fee8d;
      *puVar8 = 0;
      goto LAB_004feb02;
    }
    uVar9 = *(uint *)(Js::ArrayBufferView::ViewMask + (ulong)viewType * 4);
    srcRegSlot_00 = GetRegSlotFromTypedReg(this,slotIndex,INT32);
    if ((0x603UL >> ((ulong)viewType & 0x3f) & 1) == 0) {
      pRVar5 = IR::RegOpnd::New(TyUint32,this->m_func);
      pRVar6 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
      src2Opnd = IR::IntConstOpnd::New((ulong)uVar9,TyUint32,this->m_func,false);
      pIVar7 = IR::Instr::New(And_I4,&pRVar5->super_Opnd,&pRVar6->super_Opnd,&src2Opnd->super_Opnd,
                              this->m_func);
      AddInstr(this,pIVar7,offset);
    }
    else {
      pRVar5 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
    }
    pRVar6 = BuildSrcOpnd(this,4,TyVar);
    dstOpnd = IR::IndirOpnd::New(pRVar6,pRVar5,local_3c.type,this->m_func);
  }
  IR::Opnd::SetValueType(&dstOpnd->m_baseOpnd->super_Opnd,local_3c.arrayType);
  if ((local_3c.valueRegType & ~INT64) == FLOAT32) {
    bVar2 = IRType_IsFloat(local_3c.type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x66b,"(IRType_IsFloat(typeInfo.type))","IRType_IsFloat(typeInfo.type)");
      if (!bVar2) goto LAB_004fee8d;
      *puVar8 = 0;
    }
    if (OVar4 == LdArr) {
      this_00 = (IndirOpnd *)BuildDstOpnd(this,srcRegSlot,local_3c.type);
    }
    else {
      this_00 = (IndirOpnd *)BuildSrcOpnd(this,srcRegSlot,local_3c.type);
    }
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
  }
  else {
    bVar2 = IRType_IsNativeInt(local_3c.type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x671,"(IRType_IsNativeInt(typeInfo.type))",
                         "IRType_IsNativeInt(typeInfo.type)");
      if (!bVar2) goto LAB_004fee8d;
      *puVar8 = 0;
    }
    if (local_3c.valueRegType != INT32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x672,"(typeInfo.valueRegType == WAsmJs::INT32)",
                         "typeInfo.valueRegType == WAsmJs::INT32");
      if (!bVar2) goto LAB_004fee8d;
      *puVar8 = 0;
    }
    if (OVar4 == LdArr) {
      this_00 = (IndirOpnd *)BuildDstOpnd(this,srcRegSlot,TyInt32);
    }
    else {
      this_00 = (IndirOpnd *)BuildSrcOpnd(this,srcRegSlot,TyInt32);
    }
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
  }
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)valueType.field_0);
  src1Opnd = this_00;
  if (OVar4 == LdArr) {
    src1Opnd = dstOpnd;
    dstOpnd = this_00;
  }
  pIVar7 = IR::Instr::New((byte)typeInfo.valueRegType._3_1_ | StArrViewElem,&dstOpnd->super_Opnd,
                          &src1Opnd->super_Opnd,this->m_func);
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_01);
  if (!bVar2) {
    pRVar5 = BuildSrcOpnd(this,5,TyUint32);
    if (pIVar7->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar2) goto LAB_004fee8d;
      *puVar8 = 0;
    }
    func = pIVar7->m_func;
    if ((pRVar5->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar2) {
LAB_004fee8d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    bVar3 = (pRVar5->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      pRVar5 = (RegOpnd *)IR::Opnd::Copy(&pRVar5->super_Opnd,func);
      bVar3 = (pRVar5->super_Opnd).field_0xb;
    }
    (pRVar5->super_Opnd).field_0xb = bVar3 | 2;
    pIVar7->m_src2 = &pRVar5->super_Opnd;
  }
  AddInstr(this,pIVar7,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmTypedArr(Js::OpCodeAsmJs newOpcode, uint32 offset, uint32 slotIndex, Js::RegSlot value, Js::ArrayBufferView::ViewType viewType)
{
    bool isLd = newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::LdArrConst;
    Js::OpCode op = isLd ? Js::OpCode::LdArrViewElem : Js::OpCode::StArrViewElem;

    MemAccessTypeInfo typeInfo;
    InitializeMemAccessTypeInfo(viewType, &typeInfo);

    Js::RegSlot valueRegSlot = GetRegSlotFromTypedReg(value, typeInfo.valueRegType);
    IR::Instr * instr = nullptr;
    IR::Instr * maskInstr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    IR::IndirOpnd * indirOpnd = nullptr;

    // Get the index
    if (newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::StArr)
    {
        uint32 mask = Js::ArrayBufferView::ViewMask[viewType];
        Js::RegSlot indexRegSlot = GetRegSlotFromIntReg(slotIndex);
        IR::RegOpnd * maskedOpnd = nullptr;
        if (mask != ~0)
        {
            maskedOpnd = IR::RegOpnd::New(TyUint32, m_func);
            maskInstr = IR::Instr::New(Js::OpCode::And_I4, maskedOpnd, BuildSrcOpnd(indexRegSlot, TyInt32), IR::IntConstOpnd::New(mask, TyUint32, m_func), m_func);
            AddInstr(maskInstr, offset);
        }
        else
        {
            maskedOpnd = BuildSrcOpnd(indexRegSlot, TyInt32);
        }
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), maskedOpnd, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }
    else
    {
        Assert(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst);
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), slotIndex, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }

    // Setup the value/destination
    if (typeInfo.valueRegType == WAsmJs::FLOAT32 || typeInfo.valueRegType == WAsmJs::FLOAT64)
    {
        Assert(IRType_IsFloat(typeInfo.type));
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, typeInfo.type) : BuildDstOpnd(valueRegSlot, typeInfo.type);
        regOpnd->SetValueType(ValueType::Float);
    }
    else
    {
        Assert(IRType_IsNativeInt(typeInfo.type));
        Assert(typeInfo.valueRegType == WAsmJs::INT32);
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, TyInt32) : BuildDstOpnd(valueRegSlot, TyInt32);
        regOpnd->SetValueType(ValueType::GetInt(false));
    }

    // Create the instruction
    if (isLd)
    {
        instr = IR::Instr::New(op, regOpnd, indirOpnd, m_func);
    }
    else
    {
        instr = IR::Instr::New(op, indirOpnd, regOpnd, m_func);
    }

    if (!m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        instr->SetSrc2(BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32));
    }
    AddInstr(instr, offset);
}